

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

apx_error_t
apx_server_insert_modified_node_instance(apx_server_t *self,apx_nodeInstance_t *node_instance)

{
  adt_error_t aVar1;
  int iVar2;
  
  if (node_instance != (apx_nodeInstance_t *)0x0 && self != (apx_server_t *)0x0) {
    aVar1 = adt_ary_push_unique(&self->modified_nodes,node_instance);
    iVar2 = 2;
    if (aVar1 != '\x02') {
      iVar2 = -(uint)(aVar1 != '\0');
    }
    return iVar2;
  }
  return 1;
}

Assistant:

apx_error_t apx_server_insert_modified_node_instance(apx_server_t* self, apx_nodeInstance_t* node_instance)
{
   if ( (self != NULL) && (node_instance != NULL))
   {
      adt_error_t rc = adt_ary_push_unique(&self->modified_nodes, (void*)node_instance);
      if (rc == ADT_MEM_ERROR)
      {
         return APX_MEM_ERROR;
      }
      else if(rc != APX_NO_ERROR)
      {
         return APX_GENERIC_ERROR;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}